

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

Vec_Int_t * Gia_ManRequiredLevel(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar2;
  int iVar3;
  int iVar4;
  
  p_00 = Gia_ManReverseLevel(p);
  iVar3 = 0;
  iVar4 = 0;
  while ((iVar3 < p->vCis->nSize && (pGVar2 = Gia_ManCi(p,iVar3), pGVar2 != (Gia_Obj_t *)0x0))) {
    iVar1 = Gia_ObjId(p,pGVar2);
    iVar1 = Vec_IntEntry(p_00,iVar1);
    if (iVar4 <= iVar1) {
      iVar4 = iVar1;
    }
    iVar3 = iVar3 + 1;
  }
  iVar3 = 0;
  while( true ) {
    if (p->nObjs <= iVar3) {
      return p_00;
    }
    pGVar2 = Gia_ManObj(p,iVar3);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    iVar1 = Vec_IntEntry(p_00,iVar3);
    Vec_IntWriteEntry(p_00,iVar3,iVar4 - iVar1);
    iVar3 = iVar3 + 1;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManRequiredLevel( Gia_Man_t * p )  
{
    Vec_Int_t * vRequired;
    Gia_Obj_t * pObj;
    int i, LevelMax = 0;
    vRequired = Gia_ManReverseLevel( p );
    Gia_ManForEachCi( p, pObj, i )
        LevelMax = Abc_MaxInt( LevelMax, Vec_IntEntry(vRequired, Gia_ObjId(p, pObj)) );
    Gia_ManForEachObj( p, pObj, i )
        Vec_IntWriteEntry( vRequired, i, LevelMax - Vec_IntEntry(vRequired, i) );
    return vRequired;
}